

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<int,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToWeeksOperator>
               (int *ldata,interval_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  bool bVar1;
  undefined8 *puVar2;
  ValidityMask *mask_00;
  SelectionVector *in_RCX;
  ulong in_RDX;
  long in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  interval_t in_stack_ffffffffffffff88;
  ValidityMask *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  ulong idx_00;
  interval_t in_stack_ffffffffffffffa8;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar1) {
    for (idx_00 = 0; idx_00 < in_RDX; idx_00 = idx_00 + 1) {
      mask_00 = (ValidityMask *)SelectionVector::get_index(in_RCX,idx_00);
      in_stack_ffffffffffffff88 =
           UnaryOperatorWrapper::Operation<duckdb::ToWeeksOperator,int,duckdb::interval_t>
                     ((int)(idx_00 >> 0x20),mask_00,in_stack_ffffffffffffff88.micros,
                      in_stack_ffffffffffffff88._0_8_);
      puVar2 = (undefined8 *)(in_RSI + idx_00 * 0x10);
      *puVar2 = in_stack_ffffffffffffff88._0_8_;
      puVar2[1] = in_stack_ffffffffffffff88.micros;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe
                        ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffffa8.micros,
                         in_stack_ffffffffffffffa8._0_8_);
      if (bVar1) {
        in_stack_ffffffffffffffa8 =
             UnaryOperatorWrapper::Operation<duckdb::ToWeeksOperator,int,duckdb::interval_t>
                       ((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98,
                        (idx_t)in_stack_ffffffffffffff88.micros,in_stack_ffffffffffffff88._0_8_);
        puVar2 = (undefined8 *)(in_RSI + local_40 * 0x10);
        *puVar2 = in_stack_ffffffffffffffa8._0_8_;
        puVar2[1] = in_stack_ffffffffffffffa8.micros;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff88.micros,
                   (idx_t)in_stack_ffffffffffffff88._0_8_);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}